

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O3

void Search::start(position *p,limits *lims,bool silent)

{
  Score SVar1;
  position *ppVar2;
  pointer pRVar3;
  pointer puVar4;
  bool bVar5;
  __uniq_ptr_data<position,_std::default_delete<position>,_true,_true> this;
  ostream *poVar6;
  uint uVar7;
  Move *m;
  Move *m_00;
  Move *m_01;
  unique_ptr<position,_std::default_delete<position>_> *t;
  long lVar8;
  ulong uVar9;
  pointer puVar10;
  Score SVar11;
  pointer this_00;
  U16 depth;
  Rootmoves bestRoots;
  Threadpool<Workerthread> timer_thread;
  Movegen mvs;
  bool local_4f3;
  unsigned_short local_4f2;
  undefined1 local_4f0 [32];
  Score local_4d0;
  vector<Rootmove,_std::allocator<Rootmove>_> local_4c8;
  limits *local_4b0;
  Threadpool<Workerthread> local_4a8;
  Movegen local_3a8;
  
  puVar10 = mPositions.
            super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = mPositions.
           super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = mPositions.
            super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_4f3 = silent;
  local_4b0 = lims;
  if (mPositions.
      super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      mPositions.
      super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      std::unique_ptr<position,_std::default_delete<position>_>::~unique_ptr(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != puVar10);
    mPositions.
    super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  Threadpool<Workerthread>::Threadpool(&local_4a8,1);
  elapsed = 0.0;
  UCI_SIGNALS.stop = false;
  p->nodes_searched = 0;
  p->qnodes_searched = 0;
  Movegen::Movegen(&local_3a8,p);
  Movegen::generate<(Movetype)14,(Piece)6>(&local_3a8);
  std::vector<Rootmove,_std::allocator<Rootmove>_>::_M_erase_at_end
            (&p->root_moves,
             (p->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (0 < local_3a8.last) {
    m_01 = local_3a8.list;
    lVar8 = 0;
    do {
      bVar5 = position::is_legal(p,m_01);
      if (bVar5) {
        std::vector<Move,_std::allocator<Move>_>::vector
                  ((vector<Move,_std::allocator<Move>_> *)local_4f0,1,m_01,
                   (allocator_type *)&local_4c8);
        local_4f0._24_4_ = 0;
        local_4f0._28_4_ = ninf;
        local_4d0 = ninf;
        std::vector<Rootmove,_std::allocator<Rootmove>_>::emplace_back<Rootmove>
                  (&p->root_moves,(Rootmove *)local_4f0);
        if ((position *)local_4f0._0_8_ != (position *)0x0) {
          operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ - local_4f0._0_8_);
        }
      }
      lVar8 = lVar8 + 1;
      m_01 = m_01 + 1;
    } while (lVar8 < local_3a8.last);
  }
  if (SearchThreads.num_threads != 0) {
    uVar9 = 0;
    do {
      this.super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
      super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
      super__Head_base<0UL,_position_*,_false>._M_head_impl =
           (__uniq_ptr_impl<position,_std::default_delete<position>_>)operator_new(0x248c0);
      position::position((position *)
                         this.super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
                         super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
                         super__Head_base<0UL,_position_*,_false>._M_head_impl,p);
      local_4f0._0_8_ =
           this.super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
           super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
           super__Head_base<0UL,_position_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<position,std::default_delete<position>>,std::allocator<std::unique_ptr<position,std::default_delete<position>>>>
      ::emplace_back<std::unique_ptr<position,std::default_delete<position>>>
                ((vector<std::unique_ptr<position,std::default_delete<position>>,std::allocator<std::unique_ptr<position,std::default_delete<position>>>>
                  *)&mPositions,(unique_ptr<position,_std::default_delete<position>_> *)local_4f0);
      std::unique_ptr<position,_std::default_delete<position>_>::~unique_ptr
                ((unique_ptr<position,_std::default_delete<position>_> *)local_4f0);
      (mPositions.
       super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
       super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
       super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
       super__Head_base<0UL,_position_*,_false>._M_head_impl)->thread_id = (U16)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar9 < SearchThreads.num_threads);
  }
  uVar7 = 0x40;
  if (local_4b0->depth != 0) {
    uVar7 = local_4b0->depth;
  }
  local_4f2 = (unsigned_short)uVar7;
  LOCK();
  searching = 1;
  UNLOCK();
  Threadpool<Workerthread>::enqueue<void(&)(position&,limits&),position&,limits&>
            (&local_4a8,search_timer,p,local_4b0);
  if (1 < SearchThreads.num_threads) {
    uVar9 = 1;
    do {
      Threadpool<Searchthread>::
      enqueue<void(&)(position&,unsigned_short,bool),position&,unsigned_short&,bool&>
                (&SearchThreads,iterative_deepening,
                 mPositions.
                 super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                 super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
                 super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
                 super__Head_base<0UL,_position_*,_false>._M_head_impl,&local_4f2,&local_4f3);
      uVar9 = uVar9 + 1;
    } while (uVar9 < SearchThreads.num_threads);
  }
  Threadpool<Searchthread>::
  enqueue<void(&)(position&,unsigned_short,bool),position&,unsigned_short&,bool&>
            (&SearchThreads,iterative_deepening,
             ((mPositions.
               super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
             super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
             super__Head_base<0UL,_position_*,_false>._M_head_impl,&local_4f2,&local_4f3);
  Threadpool<Searchthread>::wait_finished(&SearchThreads);
  puVar4 = mPositions.
           super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  UCI_SIGNALS.stop = true;
  local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (mPositions.
      super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      mPositions.
      super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SVar11 = ninf;
    puVar10 = mPositions.
              super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_4f3 == false) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id: ",4);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      ppVar2 = (puVar10->_M_t).super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
               super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
               super__Head_base<0UL,_position_*,_false>._M_head_impl;
      pRVar3 = *(pointer *)
                &(ppVar2->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                 _M_impl;
      if ((*(pointer *)
            ((long)&(ppVar2->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_> + 8
            ) != pRVar3) && (SVar1 = pRVar3->score, SVar11 < SVar1)) {
        std::vector<Rootmove,_std::allocator<Rootmove>_>::operator=(&local_4c8,&ppVar2->root_moves);
        SVar11 = SVar1;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar4);
    if (local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001249fd;
  }
  std::vector<Rootmove,_std::allocator<Rootmove>_>::operator=
            (&local_4c8,
             &(((mPositions.
                 super__Vector_base<std::unique_ptr<position,_std::default_delete<position>_>,_std::allocator<std::unique_ptr<position,_std::default_delete<position>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<position,_std::default_delete<position>_>._M_t.
               super__Tuple_impl<0UL,_position_*,_std::default_delete<position>_>.
               super__Head_base<0UL,_position_*,_false>._M_head_impl)->root_moves);
LAB_001249fd:
  if (local_4f3 == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bestmove ",9);
    uci::move_to_string_abi_cxx11_
              ((string *)local_4f0,
               (uci *)((local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                        super__Vector_impl_data._M_start)->pv).
                      super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_start,m);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_4f0._0_8_,local_4f0._8_8_);
    if (local_4f0._0_8_ != (long)local_4f0 + 0x10) {
      operator_delete((void *)local_4f0._0_8_,(ulong)(local_4f0._16_8_ + 1));
    }
    if (1 < (ulong)(((long)((local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                             _M_impl.super__Vector_impl_data._M_start)->pv).
                           super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)((local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                            _M_impl.super__Vector_impl_data._M_start)->pv).
                          super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                          super__Vector_impl_data._M_start) * -0x5555555555555555)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ponder ",8);
      uci::move_to_string_abi_cxx11_
                ((string *)local_4f0,
                 (uci *)(((local_4c8.super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl
                           .super__Vector_impl_data._M_start)->pv).
                         super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                         super__Vector_impl_data._M_start + 1),m_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_4f0._0_8_,local_4f0._8_8_);
      if (local_4f0._0_8_ != (long)local_4f0 + 0x10) {
        operator_delete((void *)local_4f0._0_8_,(ulong)(local_4f0._16_8_ + 1));
      }
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  LOCK();
  searching = 0;
  UNLOCK();
  if (p->debug_search == true) {
    std::ofstream::close();
  }
  std::vector<Rootmove,_std::allocator<Rootmove>_>::~vector(&local_4c8);
  Movegen::~Movegen(&local_3a8);
  Threadpool<Workerthread>::~Threadpool(&local_4a8);
  return;
}

Assistant:

void Search::start(position& p, limits& lims, bool silent) {

	mPositions.clear();

	Threadpool<Workerthread> timer_thread(1);

	elapsed = 0;
	UCI_SIGNALS.stop = false;

	p.set_nodes_searched(0);
	p.set_qnodes_searched(0);

	// load the root moves
	Movegen mvs(p);
	mvs.generate<pseudo_legal, pieces>();
	p.root_moves.clear();
	for (int i = 0; i < mvs.size(); ++i) {
		if (!p.is_legal(mvs[i]))
			continue;
		p.root_moves.push_back(Rootmove(mvs[i]));
	}

	for (unsigned i = 0; i < SearchThreads.size(); ++i) {
		mPositions.emplace_back(std::make_unique<position>(p));
		mPositions[i]->set_id(i);
	}

	U16 depth = (lims.depth > 0 ? lims.depth : 64); // maxdepth
	searching = true;

	timer_thread.enqueue(search_timer, p, lims);


	// Launch worker threads
	if (SearchThreads.size() > 1) {
		for (unsigned i = 1; i < SearchThreads.size(); ++i)
			SearchThreads.enqueue(iterative_deepening, *mPositions[i], depth, silent);
	}

	// Launch main thread
	SearchThreads.enqueue(iterative_deepening, *mPositions[0], depth, silent);


	SearchThreads.wait_finished();
	UCI_SIGNALS.stop = true;


	U64 nodes = 0ULL;
	U64 qnodes = 0ULL;
	Rootmoves bestRoots;
	Score max = Score::ninf;
	for (auto& t : mPositions) {
		if (!silent) {
			std::cout << "id: " << t->id() << " " << t->nodes() << " " << t->qnodes() << std::endl;
		}
		nodes += t->nodes();
		qnodes += t->qnodes();

		if (t->root_moves.size() > 0 && t->root_moves[0].score > max) {
			max = t->root_moves[0].score;
			bestRoots = t->root_moves;
		}
	}

	if (bestRoots.size() <= 0)
		bestRoots = mPositions[0]->root_moves;

	if (!silent) {
		std::cout << "bestmove " << uci::move_to_string(bestRoots[0].pv[0]);
		if (bestRoots[0].pv.size() > 1)
			std::cout << " ponder " << uci::move_to_string(bestRoots[0].pv[1]);
		std::cout << std::endl;
	}

	searching = false;

	if (p.debug_search) {
		debug_file.close();
	}
}